

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  SectionTracker *this_00;
  allocator local_69;
  string local_68 [32];
  NameAndLocation local_48;
  
  this_00 = (SectionTracker *)operator_new(0x88);
  std::__cxx11::string::string(local_68,"{root}",&local_69);
  std::__cxx11::string::string((string *)&local_48,local_68);
  local_48.location.file =
       "/workspace/llm4binary/github/license_c_cmakelists/effolkronium[P]random/test/catch.hpp";
  local_48.location.line = 0x189c;
  SectionTracker::SectionTracker(this_00,&local_48,this,(ITracker *)0x0);
  Ptr<Catch::TestCaseTracking::ITracker>::operator=(&this->m_rootTracker,(ITracker *)this_00);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string(local_68);
  this->m_currentTracker = (ITracker *)0x0;
  this->m_runState = Executing;
  return (this->m_rootTracker).m_p;
}

Assistant:

inline ITracker& TrackerContext::startRun() {
        m_rootTracker = new SectionTracker( NameAndLocation( "{root}", CATCH_INTERNAL_LINEINFO ), *this, CATCH_NULL );
        m_currentTracker = CATCH_NULL;
        m_runState = Executing;
        return *m_rootTracker;
    }